

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnPool.h
# Opt level: O2

void __thiscall HttpConnPool::addFreeConn(HttpConnPool *this,HttpConnPtr *conn)

{
  EventLoop::assertInLoopThread(this->baseLoop_);
  std::__cxx11::list<std::shared_ptr<HttpConn>,_std::allocator<std::shared_ptr<HttpConn>_>_>::
  push_back(&this->freeConnPool_,conn);
  std::
  _Hashtable<int,_std::pair<const_int,_std::shared_ptr<HttpConn>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<HttpConn>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&(this->usedConnMap_)._M_h);
  return;
}

Assistant:

void addFreeConn(HttpConnPtr conn) {
        baseLoop_->assertInLoopThread();
        freeConnPool_.push_back(conn);
        usedConnMap_.erase(conn->id());
    }